

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BBlockBase.h
# Opt level: O0

void __thiscall
dg::ElemWithEdges<dg::dda::RWBBlock>::addSuccessor
          (ElemWithEdges<dg::dda::RWBBlock> *this,RWBBlock *s)

{
  bool bVar1;
  reference ppRVar2;
  RWBBlock *in_RSI;
  vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_> *in_RDI;
  RWBBlock *pred;
  iterator __end0_1;
  iterator __begin0_1;
  EdgesT *__range2_1;
  RWBBlock *succ;
  iterator __end0;
  iterator __begin0;
  EdgesT *__range2;
  vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_> *in_stack_ffffffffffffff88;
  RWBBlock *in_stack_ffffffffffffff90;
  value_type *in_stack_ffffffffffffff98;
  ElemWithEdges<dg::dda::RWBBlock> *pEVar3;
  __normal_iterator<dg::dda::RWBBlock_**,_std::vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>_>
  local_40;
  EdgesT *local_38;
  RWBBlock *local_30;
  RWBBlock **local_28;
  __normal_iterator<dg::dda::RWBBlock_**,_std::vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>_>
  local_20 [2];
  RWBBlock *local_10;
  
  local_10 = in_RSI;
  local_20[0]._M_current =
       (RWBBlock **)
       std::vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>::begin
                 (in_stack_ffffffffffffff88);
  local_28 = (RWBBlock **)
             std::vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>::end
                       (in_stack_ffffffffffffff88);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<dg::dda::RWBBlock_**,_std::vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>_>
                             *)in_stack_ffffffffffffff90,
                            (__normal_iterator<dg::dda::RWBBlock_**,_std::vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>_>
                             *)in_stack_ffffffffffffff88), bVar1) {
    ppRVar2 = __gnu_cxx::
              __normal_iterator<dg::dda::RWBBlock_**,_std::vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>_>
              ::operator*(local_20);
    local_30 = *ppRVar2;
    if (local_30 == local_10) {
      return;
    }
    __gnu_cxx::
    __normal_iterator<dg::dda::RWBBlock_**,_std::vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>_>
    ::operator++(local_20);
  }
  std::vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>::push_back
            (in_RDI,in_stack_ffffffffffffff98);
  local_38 = &(local_10->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
              super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>.
              _predecessors;
  local_40._M_current =
       (RWBBlock **)
       std::vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>::begin
                 (in_stack_ffffffffffffff88);
  std::vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>::end
            (in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<dg::dda::RWBBlock_**,_std::vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>_>
                        *)in_stack_ffffffffffffff90,
                       (__normal_iterator<dg::dda::RWBBlock_**,_std::vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar1) {
      std::vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>::push_back
                ((vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_> *)
                 in_stack_ffffffffffffff90,(value_type *)in_stack_ffffffffffffff88);
      return;
    }
    ppRVar2 = __gnu_cxx::
              __normal_iterator<dg::dda::RWBBlock_**,_std::vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>_>
              ::operator*(&local_40);
    in_stack_ffffffffffffff90 = *ppRVar2;
    pEVar3 = (ElemWithEdges<dg::dda::RWBBlock> *)0x0;
    if (in_stack_ffffffffffffff90 != (RWBBlock *)0x0) {
      pEVar3 = &(in_stack_ffffffffffffff90->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
                super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>;
    }
    if (pEVar3 == (ElemWithEdges<dg::dda::RWBBlock> *)in_RDI) break;
    __gnu_cxx::
    __normal_iterator<dg::dda::RWBBlock_**,_std::vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>_>
    ::operator++(&local_40);
  }
  return;
}

Assistant:

void addSuccessor(ElemT *s) {
        for (auto *succ : _successors) {
            if (succ == s)
                return;
        }

        _successors.push_back(s);

        for (auto *pred : s->_predecessors) {
            if (pred == this)
                return;
        }
        s->_predecessors.push_back(static_cast<ElemT *>(this));
    }